

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O2

void mk_mplayer_armor(monst *mon,short typ)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  obj *otmp;
  
  if (typ != 0) {
    otmp = mksobj(mon->dlevel,(int)typ,'\0','\0');
    uVar2 = mt_random();
    if (uVar2 % 3 == 0) {
      otmp->field_0x4b = otmp->field_0x4b | 0x10;
    }
    uVar2 = mt_random();
    if (uVar2 % 3 == 0) {
      curse(otmp);
    }
    uVar2 = mt_random();
    if (uVar2 % 3 == 0) {
      bless(otmp);
    }
    uVar2 = mt_random();
    if (uVar2 % 10 == 0) {
      iVar4 = rnd(3);
      bVar1 = -(char)iVar4;
    }
    else {
      uVar2 = mt_random();
      uVar3 = mt_random();
      if (uVar2 % 3 == 0) {
        bVar1 = (byte)uVar3 & 3 | 4;
      }
      else {
        bVar1 = (byte)((ulong)uVar3 % 5);
      }
    }
    otmp->spe = bVar1;
    mpickobj(mon,otmp);
    return;
  }
  return;
}

Assistant:

static void mk_mplayer_armor(struct monst *mon, short typ)
{
	struct obj *obj;

	if (typ == STRANGE_OBJECT) return;
	obj = mksobj(mon->dlevel, typ, FALSE, FALSE);
	if (!rn2(3)) obj->oerodeproof = 1;
	if (!rn2(3)) curse(obj);
	if (!rn2(3)) bless(obj);
	/* Most players who get to the endgame who have cursed equipment
	 * have it because the wizard or other monsters cursed it, so its
	 * chances of having plusses is the same as usual....
	 */
	obj->spe = rn2(10) ? (rn2(3) ? rn2(5) : rn1(4,4)) : -rnd(3);
	mpickobj(mon, obj);
}